

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

SIMDExtract * __thiscall
wasm::Builder::makeSIMDExtract(Builder *this,SIMDExtractOp op,Expression *vec,uint8_t index)

{
  SIMDExtract *pSVar1;
  SIMDExtract *ret;
  uint8_t index_local;
  Expression *vec_local;
  SIMDExtractOp op_local;
  Builder *this_local;
  
  pSVar1 = MixedArena::alloc<wasm::SIMDExtract>(&this->wasm->allocator);
  pSVar1->op = op;
  pSVar1->vec = vec;
  pSVar1->index = index;
  ::wasm::SIMDExtract::finalize();
  return pSVar1;
}

Assistant:

SIMDExtract*
  makeSIMDExtract(SIMDExtractOp op, Expression* vec, uint8_t index) {
    auto* ret = wasm.allocator.alloc<SIMDExtract>();
    ret->op = op;
    ret->vec = vec;
    ret->index = index;
    ret->finalize();
    return ret;
  }